

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall ParserTest_LogicalExpression_Test::TestBody(ParserTest_LogicalExpression_Test *this)

{
  _Head_base<0UL,_BinaryOpNode_*,_false> _Var1;
  _Alloc_hider _Var2;
  pointer *__ptr;
  _Head_base<0UL,_BinaryOpNode_*,_false> local_118;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_110;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_108;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_100;
  _Head_base<0UL,_BinaryOpNode_*,_false> local_f8;
  long *local_f0;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_e8;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> local_e0;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_d8;
  undefined1 local_d0 [8];
  int local_c8;
  undefined4 uStack_c4;
  BinaryOperator local_c0;
  undefined4 uStack_bc;
  string local_b8;
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  __uniq_ptr_impl<Node,_std::default_delete<Node>_> local_88;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  _Head_base<0UL,_Node_*,_false> local_68;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  local_c0 = Multiplication;
  std::make_unique<NumericLiteralNode,int>((int *)&local_118);
  local_d8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = 0xd;
  local_e8._M_head_impl._0_4_ = 5;
  std::make_unique<NumericLiteralNode,int>((int *)&local_100);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_b8,
             (BinaryOperator *)&local_118,&local_d8);
  local_e0._M_t.super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
  super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
  super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_ = 5;
  local_c8 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_f0);
  local_d0._4_4_ = 0x10;
  local_d0._0_4_ = 2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_110);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_108,
             (BinaryOperator *)&local_f0,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             (local_d0 + 4));
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)&local_f8,
             (BinaryOperator *)&local_b8,&local_e0);
  if (local_108._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_108._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_108._M_head_impl = (NumericLiteralNode *)0x0;
  if (local_110._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_110._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  if (local_f0 != (long *)0x0) {
    (**(code **)(*local_f0 + 8))();
  }
  if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
  }
  local_b8._M_dataplus._M_p = (pointer)0x0;
  if (local_100._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_100._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  if (local_118._M_head_impl != (BinaryOpNode *)0x0) {
    (*((local_118._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"2 >= 5 && 2 == 2",(allocator<char> *)&local_118);
  _Var1._M_head_impl = local_f8._M_head_impl;
  local_40[0] = Parser::parseLogicalExpression;
  local_40[1] = (code *)0x0;
  local_28 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_f8._M_head_impl = (BinaryOpNode *)0x0;
  local_30 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_88._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (tuple<Node_*,_std::default_delete<Node>_>)_Var1._M_head_impl;
  setupTest(&local_b8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_40,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_88);
  if (_Var1._M_head_impl != (BinaryOpNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])(_Var1._M_head_impl);
  }
  local_88._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)0x0;
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  std::__cxx11::string::~string((string *)&local_b8);
  local_d0._4_4_ = 2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_108);
  local_d0._0_4_ = 0xf;
  local_6c = 5;
  std::make_unique<NumericLiteralNode,int>((int *)&local_f0);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_100,
             (BinaryOperator *)&local_108,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)local_d0);
  local_90._4_4_ = 6;
  local_70 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_c0);
  local_90._0_4_ = 0x10;
  local_74 = 2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_d8);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_110,
             &local_c0,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)local_90);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)&local_118,
             (BinaryOperator *)&local_100,
             (unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)(local_90 + 4));
  local_98._4_4_ = 5;
  local_78 = 4;
  std::make_unique<NumericLiteralNode,int>((int *)&local_e0);
  local_98._0_4_ = 0xc;
  local_7c = 2;
  std::make_unique<NumericLiteralNode,int>(&local_c8);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_e8,
             (BinaryOperator *)&local_e0,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)local_98);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)&local_b8,
             (BinaryOperator *)&local_118,
             (unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)(local_98 + 4));
  _Var2._M_p = local_b8._M_dataplus._M_p;
  _Var1._M_head_impl = local_f8._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_head_impl = (BinaryOpNode *)_Var2._M_p;
  if (_Var1._M_head_impl != (BinaryOpNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
    if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
    }
  }
  local_b8._M_dataplus._M_p = (pointer)0x0;
  if (local_e8._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_e8._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_e8._M_head_impl = (NumericLiteralNode *)0x0;
  if ((long *)CONCAT44(uStack_c4,local_c8) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_c4,local_c8) + 8))();
  }
  if ((long *)CONCAT44(local_e0._M_t.
                       super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
                       super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
                       super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_,
                       local_e0._M_t.
                       super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
                       super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
                       super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_e0._M_t.
                                   super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>
                                   .super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_,
                                   local_e0._M_t.
                                   super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>
                                   .super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_)
                + 8))();
  }
  if (local_118._M_head_impl != (BinaryOpNode *)0x0) {
    (*((local_118._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_118._M_head_impl = (BinaryOpNode *)0x0;
  if (local_110._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_110._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_110._M_head_impl = (NumericLiteralNode *)0x0;
  if ((long *)CONCAT44(local_d8._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_,
                       local_d8._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_d8._M_t.
                                   super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                   .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl.
                                   _4_4_,local_d8._M_t.
                                         super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                         .super__Head_base<0UL,_NumericLiteralNode_*,_false>.
                                         _M_head_impl._0_4_) + 8))();
  }
  if ((long *)CONCAT44(uStack_bc,local_c0) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_bc,local_c0) + 8))();
  }
  if (local_100._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_100._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_100._M_head_impl = (NumericLiteralNode *)0x0;
  if (local_f0 != (long *)0x0) {
    (**(code **)(*local_f0 + 8))();
  }
  if (local_108._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_108._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"2 <= 5 || 2 == 2 && 4 > 2",(allocator<char> *)&local_118);
  _Var1._M_head_impl = local_f8._M_head_impl;
  local_60[0] = Parser::parseLogicalExpression;
  local_60[1] = (code *)0x0;
  local_f8._M_head_impl = (BinaryOpNode *)0x0;
  local_48 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_68._M_head_impl = (Node *)_Var1._M_head_impl;
  setupTest(&local_b8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_60,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_68);
  if (_Var1._M_head_impl != (BinaryOpNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])(_Var1._M_head_impl);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__cxx11::string::~string((string *)&local_b8);
  if (local_f8._M_head_impl != (BinaryOpNode *)0x0) {
    (*((local_f8._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  return;
}

Assistant:

TEST(ParserTest, LogicalExpression)
{
  auto node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::GreaterEq,
        std::make_unique<NumericLiteralNode>(5)),
      BinaryOperator::LogicalAnd,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Equal,
        std::make_unique<NumericLiteralNode>(2)));
  setupTest("2 >= 5 && 2 == 2", &Parser::parseLogicalExpression, std::move(node));

  node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::LessEq,
          std::make_unique<NumericLiteralNode>(5)),
        BinaryOperator::LogicalOr,
        std::make_unique<BinaryOpNode>(
          std::make_unique<NumericLiteralNode>(2),
          BinaryOperator::Equal,
          std::make_unique<NumericLiteralNode>(2))),
      BinaryOperator::LogicalAnd,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(4),
        BinaryOperator::Greater,
        std::make_unique<NumericLiteralNode>(2)));
  setupTest("2 <= 5 || 2 == 2 && 4 > 2", &Parser::parseLogicalExpression, std::move(node));
}